

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::
MatchExpr<const_char_*,_Catch::Matchers::Impl::MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::MatchExpr(MatchExpr<const_char_*,_Catch::Matchers::Impl::MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,char **arg,
           MatchNotOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *matcher,StringRef *matcherString)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  allocator local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::__cxx11::string::string((string *)local_40,*arg,&local_41);
  iVar3 = (*(matcher->
            super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).super_MatcherUntypedBase._vptr_MatcherUntypedBase[3])(matcher,local_40);
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR___cxa_pure_virtual_0026cdc8;
  (this->super_ITransientExpression).m_isBinaryExpression = true;
  (this->super_ITransientExpression).m_result = SUB41(iVar3,0);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  (this->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00265b38;
  this->m_arg = arg;
  (this->m_matcher).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_0026c2a0;
  (this->m_matcher).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)&(this->m_matcher).
                 super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .super_MatcherUntypedBase.m_cachedToString.field_2;
  pcVar1 = (matcher->
           super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->m_matcher).
              super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .super_MatcherUntypedBase.m_cachedToString,pcVar1,
             pcVar1 + (matcher->
                      super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).super_MatcherUntypedBase.m_cachedToString._M_string_length);
  (this->m_matcher).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_00265b78;
  (this->m_matcher).
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_00265ba8;
  (this->m_matcher).m_underlyingMatcher = matcher->m_underlyingMatcher;
  sVar2 = matcherString->m_size;
  (this->m_matcherString).m_start = matcherString->m_start;
  (this->m_matcherString).m_size = sVar2;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}